

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGen::FileNameWithoutLastExtension_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename)

{
  cmQtAutoGen cVar1;
  cmQtAutoGen *pcVar2;
  cmQtAutoGen *pcVar3;
  cmQtAutoGen *pcVar4;
  cmQtAutoGen *pcVar5;
  cmQtAutoGen *pcVar6;
  bool bVar7;
  
  pcVar5 = (cmQtAutoGen *)filename._M_len;
  if (this != (cmQtAutoGen *)0x0) {
    pcVar4 = pcVar5 + 1;
    pcVar3 = (cmQtAutoGen *)0x0;
    pcVar6 = pcVar5;
    do {
      pcVar2 = pcVar3;
      pcVar6 = pcVar6 + -1;
      pcVar3 = this;
      if (this == pcVar2) goto LAB_00587b66;
      pcVar4 = pcVar4 + -1;
      pcVar3 = pcVar2 + 1;
    } while (this[(long)pcVar6] != (cmQtAutoGen)0x2f);
    pcVar5 = pcVar4 + (long)this;
    pcVar3 = pcVar2;
LAB_00587b66:
    if (pcVar3 != (cmQtAutoGen *)0x0) {
      pcVar6 = this + (long)pcVar3 + (long)pcVar6;
      pcVar4 = pcVar3;
      do {
        bVar7 = pcVar4 == (cmQtAutoGen *)0x0;
        pcVar4 = pcVar4 + -1;
        pcVar2 = (cmQtAutoGen *)0xffffffffffffffff;
        if (bVar7) break;
        cVar1 = *pcVar6;
        pcVar6 = pcVar6 + -1;
        pcVar2 = pcVar4;
      } while (cVar1 != (cmQtAutoGen)0x2e);
      goto LAB_00587b8a;
    }
  }
  pcVar3 = (cmQtAutoGen *)0x0;
  pcVar2 = (cmQtAutoGen *)0xffffffffffffffff;
LAB_00587b8a:
  if (pcVar3 < pcVar2) {
    pcVar2 = pcVar3;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar5,pcVar2 + (long)pcVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::FileNameWithoutLastExtension(cm::string_view filename)
{
  auto slashPos = filename.rfind('/');
  if (slashPos != cm::string_view::npos) {
    filename.remove_prefix(slashPos + 1);
  }
  auto dotPos = filename.rfind('.');
  return std::string(filename.substr(0, dotPos));
}